

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O2

int rdacc_den(char *dir,vector_t ****inout_wt_mean,vector_t ****inout_wt_var,int32 *inout_pass2var,
             float32 ****inout_dnom,uint32 *inout_n_mgau,uint32 *inout_n_stream,
             uint32 *inout_n_density,uint32 **inout_veclen)

{
  uint32 uVar1;
  vector_t ***ppppfVar2;
  int iVar3;
  char *out_n_feat;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32 n_stream;
  uint32 n_density;
  uint32 n_mgau;
  int32 pass2var;
  uint32 *in_veclen;
  vector_t ***in_wt_var;
  vector_t ***in_wt_mean;
  float32 ***in_dnom;
  float32 ***local_1050;
  vector_t ***local_1048;
  vector_t ***local_1040;
  char fn [4097];
  
  sprintf(fn,"%s/gauden_counts",dir);
  out_n_feat = (char *)&n_stream;
  iVar3 = s3gaucnt_read(fn,&in_wt_mean,&in_wt_var,&pass2var,&in_dnom,&n_mgau,(uint32 *)out_n_feat,
                        &n_density,&in_veclen);
  if (iVar3 == 0) {
    local_1048 = *inout_wt_mean;
    ppppfVar2 = *inout_wt_var;
    if (local_1048 == (vector_t ***)0x0) {
      *inout_wt_mean = in_wt_mean;
      *inout_dnom = in_dnom;
      *inout_n_mgau = n_mgau;
      *inout_n_stream = n_stream;
      *inout_n_density = n_density;
      *inout_veclen = in_veclen;
      *inout_pass2var = pass2var;
      if (in_wt_var == (vector_t ***)0x0 || ppppfVar2 != (vector_t ***)0x0) {
        return 0;
      }
      *inout_wt_var = in_wt_var;
      return 0;
    }
    local_1050 = *inout_dnom;
    uVar1 = *inout_n_mgau;
    bVar6 = uVar1 != n_mgau;
    if (bVar6) {
      out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0xf3,"# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",fn,
              (ulong)n_mgau,out_n_feat);
    }
    uVar1 = *inout_n_stream;
    bVar7 = uVar1 != n_stream;
    if (bVar7) {
      out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0xfa,"# stream for file %s (== %u) != prior # stream (== %u)\n",fn,(ulong)n_stream,
              out_n_feat);
    }
    uVar1 = *inout_n_density;
    bVar8 = uVar1 != n_density;
    if (bVar8) {
      out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x101,"# density comp/mix for file %s (== %u) != prior # density, %u\n",fn,
              (ulong)n_density,out_n_feat);
    }
    bVar8 = bVar8 || (bVar7 || bVar6);
    local_1040 = ppppfVar2;
    if (*inout_pass2var != pass2var) {
      out_n_feat = "true";
      pcVar4 = "true";
      if (pass2var == 0) {
        pcVar4 = "false";
      }
      if (*inout_pass2var == 0) {
        out_n_feat = "false";
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x108,"2 pass var %s in %s, but %s in others.\n",fn,pcVar4,out_n_feat);
      bVar8 = true;
    }
    for (uVar5 = 0; uVar5 < n_stream; uVar5 = uVar5 + 1) {
      if ((*inout_veclen)[uVar5] != in_veclen[uVar5]) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),(*inout_veclen)[uVar5]);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x110,"vector length of stream %u (== %u) != prior length (== %u)\n",
                uVar5 & 0xffffffff,(ulong)in_veclen[uVar5],out_n_feat);
        bVar8 = true;
      }
    }
    ckd_free(in_veclen);
    if (!bVar8) {
      accum_3d(local_1050,in_dnom,n_mgau,n_stream,n_density);
      gauden_accum_param(local_1048,in_wt_mean,n_mgau,n_stream,n_density,*inout_veclen);
      gauden_free_param(in_wt_mean);
      if (local_1040 == (vector_t ***)0x0) {
        return 0;
      }
      if (in_wt_var != (vector_t ***)0x0) {
        gauden_accum_param(local_1040,in_wt_var,n_mgau,n_stream,n_density,*inout_veclen);
        gauden_free_param(in_wt_var);
        return 0;
      }
      __assert_fail("in_wt_var",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                    ,0x122,
                    "int rdacc_den(const char *, vector_t ****, vector_t ****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                   );
    }
  }
  else {
    fflush(_stdout);
    perror(fn);
  }
  return -1;
}

Assistant:

int
rdacc_den(const char *dir,
          vector_t **** inout_wt_mean,
          vector_t **** inout_wt_var,
          int32 * inout_pass2var,
          float32 **** inout_dnom,
          uint32 * inout_n_mgau,
          uint32 * inout_n_stream,
          uint32 * inout_n_density, uint32 ** inout_veclen)
{
    char fn[MAXPATHLEN + 1];
    vector_t ***in_wt_mean;
    vector_t ***wt_mean;
    vector_t ***in_wt_var;
    vector_t ***wt_var;
    float32 ***in_dnom;
    float32 ***dnom;
    uint32 n_mgau;
    uint32 n_stream;
    uint32 n_density;
    int32 pass2var;
    int i;

    uint32 *in_veclen;

    sprintf(fn, "%s/gauden_counts", dir);

    if (s3gaucnt_read(fn,
                      &in_wt_mean,
                      &in_wt_var,
                      &pass2var,
                      &in_dnom,
                      &n_mgau,
                      &n_stream, &n_density, &in_veclen) != S3_SUCCESS) {
        fflush(stdout);
        perror(fn);

        return S3_ERROR;
    }

    wt_mean = *inout_wt_mean;
    wt_var = *inout_wt_var;
    dnom = *inout_dnom;

    if (wt_mean == NULL) {

        /* if a gauden_counts file exists, it will have reestimated means */

        *inout_wt_mean = wt_mean = in_wt_mean;
        *inout_dnom = dnom = in_dnom;
        *inout_n_mgau = n_mgau;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
        *inout_veclen = in_veclen;
        *inout_pass2var = pass2var;

        if (wt_var == NULL && in_wt_var != NULL) {
            *inout_wt_var = wt_var = in_wt_var;
        }
    }
    else {
        int err = FALSE;

        /* check if matrices are able to be added */
        if (*inout_n_mgau != n_mgau) {
            E_ERROR
                ("# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",
                 fn, n_mgau, *inout_n_mgau);
            err = TRUE;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream for file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            err = TRUE;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix for file %s (== %u) != prior # density, %u\n",
                 fn, n_density, *inout_n_density);
            err = TRUE;
        }

        if (*inout_pass2var != pass2var) {
            E_ERROR("2 pass var %s in %s, but %s in others.\n",
                    fn, (pass2var ? "true" : "false"),
                    (*inout_pass2var ? "true" : "false"));
            err = TRUE;
        }

        for (i = 0; i < n_stream; i++) {
            if ((*inout_veclen)[i] != in_veclen[i]) {
                E_ERROR
                    ("vector length of stream %u (== %u) != prior length (== %u)\n",
                     i, in_veclen[i], (*inout_veclen)[i]);
                err = TRUE;
            }
        }

        ckd_free(in_veclen);

        if (err)
            return S3_ERROR;

        /* accumulate values */
        accum_3d(dnom, in_dnom, n_mgau, n_stream, n_density);

        gauden_accum_param(wt_mean, in_wt_mean,
                           n_mgau, n_stream, n_density, *inout_veclen);
        gauden_free_param(in_wt_mean);

        if (wt_var) {
            assert(in_wt_var);

            gauden_accum_param(wt_var, in_wt_var,
                               n_mgau, n_stream, n_density, *inout_veclen);
            gauden_free_param(in_wt_var);
        }
    }

    return S3_SUCCESS;
}